

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
phosg::list_processes_abi_cxx11_
          (unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,phosg *this,bool with_commands)

{
  bool bVar1;
  int iVar2;
  char *__s;
  FILE *pFVar3;
  pointer p_Var4;
  undefined1 local_b0 [8];
  string name;
  int local_88;
  int ch;
  pid_t pid;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  bool with_commands_local;
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *ret;
  
  f._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl._7_1_ = (byte)this & 1;
  __s = "ps -ax -c -o pid -o command | grep [0-9]";
  if (((ulong)this & 1) != 0) {
    __s = "ps -ax -o pid -o command | grep [0-9]";
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pid,"r",(allocator<char> *)((long)&ch + 3));
  popen_unique((phosg *)local_28,&local_48,(string *)&pid);
  ::std::__cxx11::string::~string((string *)&pid);
  ::std::allocator<char>::~allocator((allocator<char> *)((long)&ch + 3));
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::allocator<char>::~allocator(&local_49);
  ch._2_1_ = 0;
  ::std::
  unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(__return_storage_ptr__);
  do {
    pFVar3 = (FILE *)::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                               ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_28);
    iVar2 = feof(pFVar3);
    if (iVar2 != 0) {
      ch._2_1_ = 1;
      ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr
                ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_28);
      return __return_storage_ptr__;
    }
    p_Var4 = ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                       ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_28);
    __isoc99_fscanf(p_Var4,"%d",&local_88);
    do {
      pFVar3 = (FILE *)::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_28);
      iVar2 = fgetc(pFVar3);
      name.field_2._12_4_ = iVar2;
    } while (iVar2 == 0x20);
    pFVar3 = (FILE *)::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                               ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_28);
    ungetc(iVar2,pFVar3);
    ::std::__cxx11::string::string((string *)local_b0);
    while (name.field_2._12_4_ != 10) {
      pFVar3 = (FILE *)::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::get
                                 ((unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> *)local_28);
      name.field_2._12_4_ = fgetc(pFVar3);
      if (name.field_2._12_4_ == -1) break;
      if ((0x1f < (int)name.field_2._12_4_) && ((int)name.field_2._12_4_ < 0x7f)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   name.field_2._M_local_buf[0xc]);
      }
    }
    bVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                      );
    if (!bVar1) {
      ::std::
      unordered_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::emplace<int&,std::__cxx11::string&>
                ((unordered_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)__return_storage_ptr__,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0);
    }
    ::std::__cxx11::string::~string((string *)local_b0);
  } while( true );
}

Assistant:

unordered_map<pid_t, string> list_processes(bool with_commands) {

  auto f = popen_unique(with_commands ? "ps -ax -o pid -o command | grep [0-9]" : "ps -ax -c -o pid -o command | grep [0-9]", "r");

  unordered_map<pid_t, string> ret;
  while (!feof(f.get())) {
    pid_t pid;
    fscanf(f.get(), "%d", &pid);

    int ch;
    while ((ch = fgetc(f.get())) == ' ')
      ;
    ungetc(ch, f.get());

    string name;
    while (ch != '\n') {
      ch = fgetc(f.get());
      if (ch == EOF) {
        break;
      }
      if (ch >= 0x20 && ch < 0x7F) {
        name += (char)ch;
      }
    }

    if (!name.empty()) {
      ret.emplace(pid, name);
    }
  }

  return ret;
}